

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

void basist::astc_encode_trits(uint32_t *pOutput,uint8_t *pValues,int *bit_pos,int n)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int bits [5];
  uint local_38 [8];
  
  bVar4 = (byte)n;
  lVar9 = 0;
  iVar7 = 0;
  do {
    iVar7 = iVar7 + (uint)(*pValues >> (bVar4 & 0x1f)) *
                    *(int *)((long)astc_encode_trits::s_muls + lVar9);
    *(uint *)((long)local_38 + lVar9) = (uint)*pValues & ~(-1 << (bVar4 & 0x1f));
    lVar9 = lVar9 + 4;
    pValues = pValues + 1;
  } while (lVar9 != 0x14);
  if (iVar7 < 0xf3) {
    bVar2 = g_astc_trit_encode[iVar7];
    iVar7 = n * 2 + 2;
    if (iVar7 != 0) {
      uVar6 = local_38[1] << (bVar4 + 2 & 0x1f) | (bVar2 & 3) << (bVar4 & 0x1f) | local_38[0];
      do {
        uVar5 = *bit_pos & 7;
        iVar8 = 8 - uVar5;
        if (iVar7 < iVar8) {
          iVar8 = iVar7;
        }
        pbVar1 = (byte *)((long)pOutput + (long)(*bit_pos >> 3));
        *pbVar1 = *pbVar1 | (byte)(uVar6 << (sbyte)uVar5);
        *bit_pos = *bit_pos + iVar8;
        uVar6 = uVar6 >> ((byte)iVar8 & 0x1f);
        iVar7 = iVar7 - iVar8;
      } while (iVar7 != 0);
    }
    iVar7 = n * 3 + 6;
    if (iVar7 != 0) {
      cVar3 = (char)(n * 2);
      uVar6 = local_38[4] << (cVar3 + 5U & 0x1f) |
              local_38[3] << (bVar4 + 3 & 0x1f) |
              (bVar2 >> 2 & 3) + local_38[2] * 4 |
              (bVar2 >> 5 & 3) << (cVar3 + 3U & 0x1f) |
              (uint)(bVar2 >> 7) << ((char)(n * 3) + 5U & 0x1f) |
              (bVar2 >> 4 & 1) << (bVar4 + 2 & 0x1f);
      do {
        uVar5 = *bit_pos & 7;
        iVar8 = 8 - uVar5;
        if (iVar7 < iVar8) {
          iVar8 = iVar7;
        }
        pbVar1 = (byte *)((long)pOutput + (long)(*bit_pos >> 3));
        *pbVar1 = *pbVar1 | (byte)(uVar6 << (sbyte)uVar5);
        *bit_pos = *bit_pos + iVar8;
        uVar6 = uVar6 >> ((byte)iVar8 & 0x1f);
        iVar7 = iVar7 - iVar8;
      } while (iVar7 != 0);
    }
    return;
  }
  __assert_fail("trits < 243",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                ,0x13fd,"void basist::astc_encode_trits(uint32_t *, const uint8_t *, int &, int)");
}

Assistant:

static void astc_encode_trits(uint32_t* pOutput, const uint8_t* pValues, int& bit_pos, int n)
	{
		// First extract the trits and the bits from the 5 input values
		int trits = 0, bits[5];
		const uint32_t bit_mask = (1 << n) - 1;
		for (int i = 0; i < 5; i++)
		{
			static const int s_muls[5] = { 1, 3, 9, 27, 81 };

			const int t = pValues[i] >> n;

			trits += t * s_muls[i];
			bits[i] = pValues[i] & bit_mask;
		}

		// Encode the trits, by inverting the bit manipulations done by the decoder, converting 5 trits into 8-bits.
		// See https://www.khronos.org/registry/DataFormat/specs/1.2/dataformat.1.2.html#astc-integer-sequence-encoding

		assert(trits < 243);
		const int T = g_astc_trit_encode[trits];

		// Now interleave the 8 encoded trit bits with the bits to form the encoded output. See table 94.
		astc_set_bits(pOutput, bit_pos, bits[0] | (astc_extract_bits(T, 0, 1) << n) | (bits[1] << (2 + n)), n * 2 + 2);

		astc_set_bits(pOutput, bit_pos, astc_extract_bits(T, 2, 3) | (bits[2] << 2) | (astc_extract_bits(T, 4, 4) << (2 + n)) | (bits[3] << (3 + n)) | (astc_extract_bits(T, 5, 6) << (3 + n * 2)) |
			(bits[4] << (5 + n * 2)) | (astc_extract_bits(T, 7, 7) << (5 + n * 3)), n * 3 + 6);
	}